

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

bool __thiscall storage::BTree::_search_(BTree *this,int key,Record **out)

{
  int iVar1;
  BTNode *pBVar2;
  char cVar3;
  int iVar4;
  BTInnerNode *this_00;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  BTNode *node;
  BTNode *local_38;
  
  pBVar2 = this->root_;
  if (pBVar2 == (BTNode *)0x0) {
    bVar6 = false;
  }
  else {
    local_38 = pBVar2;
    iVar4 = (**pBVar2->_vptr_BTNode)(pBVar2);
    cVar3 = (char)iVar4;
    while (cVar3 == '\0') {
      this_00 = (BTInnerNode *)__dynamic_cast(pBVar2,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      BTInnerNode::search_node(this_00,key,&local_38);
      pBVar2 = local_38;
      iVar4 = (**local_38->_vptr_BTNode)(local_38);
      cVar3 = (char)iVar4;
    }
    iVar8 = 0;
    lVar5 = __dynamic_cast(pBVar2,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    iVar4 = *(int *)(lVar5 + 0xdc) + -2;
    do {
      bVar6 = iVar8 <= iVar4;
      if (iVar4 < iVar8) {
        return bVar6;
      }
      iVar7 = (iVar4 - iVar8 >> 1) + iVar8;
      iVar1 = *(int *)(lVar5 + 0x14 + (long)iVar7 * 4);
      if (iVar1 == key) {
        *out = *(Record **)(lVar5 + 0xe0 + (long)iVar7 * 8);
      }
      else if (key < iVar1) {
        iVar4 = iVar7 + -1;
      }
      else {
        iVar8 = iVar7 + 1;
      }
    } while (iVar1 != key);
  }
  return bVar6;
}

Assistant:

bool BTree::_search_(int key, Record *&out) {
        if (!root_)
            return false;
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        int index = -1;
        return dynamic_cast<BTLeafNode *>(node)->search_record(key, out, index);
    }